

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

double cos_power_int(double a,double b,int n)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double __x;
  double __x_00;
  double dVar4;
  double dVar5;
  double __y;
  double local_20;
  
  if (-1 < n) {
    dVar2 = sin(a);
    dVar3 = sin(b);
    __x = cos(a);
    __x_00 = cos(b);
    if ((n & 1U) == 0) {
      local_20 = b - a;
    }
    else {
      local_20 = dVar3 - dVar2;
    }
    for (uVar1 = n & 1U | 2; (int)uVar1 <= n; uVar1 = uVar1 + 2) {
      __y = (double)(int)(uVar1 - 1);
      dVar4 = pow(__x,__y);
      dVar5 = pow(__x_00,__y);
      local_20 = (dVar5 * dVar3 + (local_20 * __y - dVar4 * dVar2)) / (double)(int)uVar1;
    }
    return local_20;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"COS_POWER_INT - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Power N < 0.\n");
  exit(1);
}

Assistant:

double cos_power_int ( double a, double b, int n )

//****************************************************************************80
//
//  Purpose:
//
//    COS_POWER_INT evaluates the cosine power integral.
//
//  Discussion:
//
//    The function is defined by
//
//      COS_POWER_INT(A,B,N) = Integral ( A <= T <= B ) ( cos ( t ))^n dt
//
//    The algorithm uses the following fact:
//
//      Integral cos^n ( t ) = -(1/n) * (
//        cos^(n-1)(t) * sin(t) + ( n-1 ) * Integral cos^(n-2) ( t ) dt )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    31 March 2012
//
//  Author:
//
//    John Burkardt
//
//  Parameters
//
//    Input, double A, B, the limits of integration.
//
//    Input, integer N, the power of the sine function.
//
//    Output, double COS_POWER_INT, the value of the integral.
//
{
  double ca;
  double cb;
  int m;
  int mlo;
  double sa;
  double sb;
  double value;

  if ( n < 0 )
  {
    std::cerr << "\n";
    std::cerr << "COS_POWER_INT - Fatal error!\n";
    std::cerr << "  Power N < 0.\n";
    exit ( 1 );
  }

  sa = sin ( a );
  sb = sin ( b );
  ca = cos ( a );
  cb = cos ( b );

  if ( ( n % 2 ) == 0 )
  {
    value = b - a;
    mlo = 2;
  }
  else
  {
    value = sb - sa;
    mlo = 3;
  }

  for ( m = mlo; m <= n; m = m + 2 )
  {
    value = ( double( m - 1 ) * value 
      - pow ( ca, (m-1) ) * sa + pow ( cb, (m-1) ) * sb ) 
      / double( m );
  }

  return value;
}